

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O2

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  CacheEntryType type;
  CacheEntryType CVar6;
  size_t sVar7;
  char *__dest;
  ulong uVar8;
  cmState *this_00;
  char *pcVar9;
  pointer pbVar10;
  pointer pbVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  char *variable;
  string currValue;
  string value;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_50;
  pointer local_40;
  ulong local_38;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&value,"called with incorrect number of arguments",(allocator *)&currValue)
    ;
    cmCommand::SetError(&this->super_cmCommand,&value);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  variable = (pbVar10->_M_dataplus)._M_p;
  bVar2 = cmHasLiteralPrefix<char_const*,5ul>(&variable,(char (*) [5])"ENV{");
  pcVar9 = variable;
  if ((bVar2) && (sVar7 = strlen(variable), 5 < sVar7)) {
    __dest = (char *)operator_new__(sVar7);
    sVar7 = strlen(pcVar9);
    strncpy(__dest,pcVar9 + 4,sVar7 - 5);
    sVar7 = strlen(pcVar9);
    __dest[sVar7 - 5] = '\0';
    std::__cxx11::string::string((string *)&value,__dest,(allocator *)&currValue);
    std::__cxx11::string::append((char *)&value);
    currValue._M_dataplus._M_p = (pointer)&currValue.field_2;
    currValue._M_string_length = 0;
    currValue.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::GetEnv(__dest,&currValue);
    operator_delete__(__dest);
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) < 0x21) ||
       (pbVar10[1]._M_string_length == 0)) {
      if (bVar2) goto LAB_0032c2e9;
    }
    else if ((!bVar2) || (bVar2 = std::operator!=(&currValue,pbVar10 + 1), bVar2)) {
      std::__cxx11::string::append((string *)&value);
LAB_0032c2e9:
      cmsys::SystemTools::PutEnv(&value);
    }
    std::__cxx11::string::~string((string *)&currValue);
LAB_0032c2fd:
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pbVar11 - (long)pbVar10;
  if ((long)uVar8 >> 5 == 2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)pbVar10 + (uVar8 - 0x20)),"PARENT_SCOPE");
    if (bVar2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&value,variable,(allocator *)&currValue);
      cmMakefile::RaiseScope(pcVar1,&value,(char *)0x0);
      goto LAB_0032c2fd;
    }
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (long)pbVar11 - (long)pbVar10;
  }
  else if ((long)uVar8 >> 5 == 1) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&value,variable,(allocator *)&currValue);
    cmMakefile::RemoveDefinition(pcVar1,&value);
    goto LAB_0032c2fd;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  if (uVar8 < 0x21) {
LAB_0032c39c:
    bVar3 = false;
    uVar12 = 0;
LAB_0032c39f:
    if ((ulong)((long)uVar8 >> 5) < 4) {
      bVar4 = false;
      bVar2 = false;
    }
    else {
      bVar4 = std::operator==(pbVar10 + (((long)uVar8 >> 5) - (ulong)bVar3) + -3,"CACHE");
      uVar5 = uVar12 + 3;
      if (!bVar4) {
        uVar5 = uVar12;
      }
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = false;
      uVar12 = uVar5;
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pbVar10[-1]._M_dataplus._M_p + uVar8),"PARENT_SCOPE");
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    if (!bVar2) {
      uVar8 = (long)pbVar11 - (long)pbVar10;
      if (uVar8 < 0x81) goto LAB_0032c39c;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)pbVar10 + (uVar8 - 0x20)),"FORCE");
      uVar12 = (uint)bVar3;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (long)pbVar11 - (long)pbVar10;
      goto LAB_0032c39f;
    }
    bVar2 = true;
    bVar4 = false;
    uVar12 = 1;
  }
  local_50.Begin._M_current = pbVar10 + 1;
  local_50.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)pbVar11 - (ulong)(uVar12 << 5));
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&currValue,&local_50,";");
  std::__cxx11::string::operator=((string *)&value,(string *)&currValue);
  std::__cxx11::string::~string((string *)&currValue);
  if (bVar2) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&currValue,variable,(allocator *)&local_50);
    cmMakefile::RaiseScope(pcVar1,&currValue,value._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&currValue);
    bVar14 = true;
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1,"CACHE");
    if (!bVar2) {
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
      if (((uVar8 < 0x21) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)pbVar10 + (uVar8 - 0x40)),"CACHE"), !bVar2)) &&
         (bVar3 != true || bVar4 != false)) {
        local_38 = (ulong)bVar3;
        if (bVar4 == false) {
          type = STRING;
          local_40 = (pointer)0x0;
        }
        else {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar13 = ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5) -
                   local_38;
          type = cmState::StringToCacheEntryType(pbVar10[lVar13 + -2]._M_dataplus._M_p);
          local_40 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar13 + -1]._M_dataplus._M_p;
        }
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&currValue,variable,(allocator *)&local_50);
        pcVar9 = cmState::GetCacheEntryValue(this_00,&currValue);
        std::__cxx11::string::~string((string *)&currValue);
        if (pcVar9 == (char *)0x0) {
          bVar2 = false;
        }
        else {
          std::__cxx11::string::string((string *)&currValue,variable,(allocator *)&local_50);
          CVar6 = cmState::GetCacheEntryType(this_00,&currValue);
          bVar2 = CVar6 != UNINITIALIZED;
          std::__cxx11::string::~string((string *)&currValue);
        }
        bVar14 = true;
        if ((bVar3 != false) || ((bVar2 & bVar4 & type != INTERNAL) == 0)) {
          pcVar1 = (this->super_cmCommand).Makefile;
          if (bVar4 == false) {
            std::__cxx11::string::string((string *)&currValue,variable,(allocator *)&local_50);
            cmMakefile::AddDefinition(pcVar1,&currValue,value._M_dataplus._M_p);
          }
          else {
            std::__cxx11::string::string((string *)&currValue,variable,(allocator *)&local_50);
            cmMakefile::AddCacheDefinition
                      (pcVar1,&currValue,value._M_dataplus._M_p,local_40,type,SUB81(local_38,0));
          }
          std::__cxx11::string::~string((string *)&currValue);
        }
        goto LAB_0032c52e;
      }
    }
    std::__cxx11::string::string
              ((string *)&currValue,"given invalid arguments for CACHE mode.",(allocator *)&local_50
              );
    cmCommand::SetError(&this->super_cmCommand,&currValue);
    std::__cxx11::string::~string((string *)&currValue);
    bVar14 = false;
  }
LAB_0032c52e:
  std::__cxx11::string::~string((string *)&value);
  return bVar14;
}

Assistant:

bool cmSetCommand::InitialPass(std::vector<std::string> const& args,
                               cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5) {
    // what is the variable name
    char* varName = new char[strlen(variable)];
    strncpy(varName, variable + 4, strlen(variable) - 5);
    varName[strlen(variable) - 5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    std::string currValue;
    const bool currValueSet = cmSystemTools::GetEnv(varName, currValue);
    delete[] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty()) {
      // but only if it is different from current value
      if (!currValueSet || currValue != args[1]) {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
      }
      return true;
    }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValueSet) {
      cmSystemTools::PutEnv(putEnvArg);
    }
    return true;
  }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
  // in the parent scope.
  if (args.size() == 2 && args[args.size() - 1] == "PARENT_SCOPE") {
    this->Makefile->RaiseScope(variable, CM_NULLPTR);
    return true;
  }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmStateEnums::CacheEntryType type =
    cmStateEnums::STRING;             // required if cache
  const char* docstring = CM_NULLPTR; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size() - 1] == "PARENT_SCOPE") {
    parentScope = true;
    ignoreLastArgs++;
  } else {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size() - 1] == "FORCE") {
      force = true;
      ignoreLastArgs++;
    }

    // check for cache signature
    if (args.size() > 3 &&
        args[args.size() - 3 - (force ? 1 : 0)] == "CACHE") {
      cache = true;
      ignoreLastArgs += 3;
    }
  }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope) {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
  }

  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache)) {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
  }

  if (cache) {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart + 1].c_str());
    docstring = args[cacheStart + 2].c_str();
  }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if (existingValue &&
      (state->GetCacheEntryType(variable) != cmStateEnums::UNINITIALIZED)) {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if (cache && type != cmStateEnums::INTERNAL && !force) {
      return true;
    }
  }

  // if it is meant to be in the cache then define it in the cache
  if (cache) {
    this->Makefile->AddCacheDefinition(variable, value.c_str(), docstring,
                                       type, force);
  } else {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
  }
  return true;
}